

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_OperatorEquals_Test<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_OperatorEquals_Test<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  AssertHelper *this_00;
  value_type pcVar2;
  char *file;
  key_type rhs_expression;
  uint *lhs;
  AssertHelper *this_01;
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *this_02;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  TypeParam ht2_2;
  TypeParam ht1_2;
  AssertionResult gtest_ar;
  TypeParam ht2_1;
  TypeParam ht1_1;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  TypeParam ht2;
  TypeParam ht1;
  undefined4 in_stack_fffffffffffff8c8;
  int in_stack_fffffffffffff8cc;
  HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff8d0;
  uint *in_stack_fffffffffffff8d8;
  int iVar3;
  HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff8e0;
  key_equal *in_stack_fffffffffffff8e8;
  hasher *in_stack_fffffffffffff8f0;
  size_type in_stack_fffffffffffff8f8;
  Type type;
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffff900;
  char *in_stack_fffffffffffff930;
  char *in_stack_fffffffffffff938;
  char *in_stack_fffffffffffff940;
  undefined4 in_stack_fffffffffffff948;
  undefined4 in_stack_fffffffffffff94c;
  uint i;
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff950;
  AssertionResult local_610 [2];
  char *local_5f0;
  undefined4 local_5e4;
  AssertionResult local_5e0 [3];
  value_type local_5a8;
  AssertHelper *local_5a0;
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> local_598;
  Hasher local_588;
  Hasher local_57c [12];
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> local_4e8;
  Hasher local_4d8;
  Hasher local_4cc [13];
  size_type local_428;
  undefined4 local_41c;
  AssertionResult local_418 [3];
  value_type local_3e0;
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> local_3d8;
  Hasher local_3c8;
  Hasher local_3bc [12];
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> local_328;
  Hasher local_318;
  Hasher local_30c [12];
  string local_278 [55];
  undefined1 local_241;
  AssertionResult local_240;
  string local_230 [55];
  byte local_1f9;
  AssertionResult local_1f8 [3];
  value_type local_1c0;
  value_type local_190;
  key_type local_188;
  key_type local_180;
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> local_178;
  Hasher local_168;
  Hasher local_15c [13];
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> local_b8;
  Hasher local_a8;
  Hasher local_9c [13];
  
  Hasher::Hasher(local_9c,0);
  Hasher::Hasher(&local_a8,0);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::Alloc(&local_b8,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            (in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0,
             in_stack_fffffffffffff8e8,(allocator_type *)in_stack_fffffffffffff8e0);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_b8);
  Hasher::Hasher(local_15c,0);
  Hasher::Hasher(&local_168,0);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::Alloc(&local_178,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            (in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0,
             in_stack_fffffffffffff8e8,(allocator_type *)in_stack_fffffffffffff8e0);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_178);
  local_180 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff8e0,(int)((ulong)in_stack_fffffffffffff8d8 >> 0x20))
  ;
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                     *)in_stack_fffffffffffff8d0,
                    (key_type *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
  local_188 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff8e0,(int)((ulong)in_stack_fffffffffffff8d8 >> 0x20))
  ;
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                     *)in_stack_fffffffffffff8d0,
                    (key_type *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
  local_190 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff8d0,in_stack_fffffffffffff8cc);
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff950,
           (value_type *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
  local_1c0 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff8d0,in_stack_fffffffffffff8cc);
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff950,
           (value_type *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
  bVar1 = google::
          BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffff8d0,
                       (BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
  local_1f9 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff8d0,
             (bool *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8),(type *)0xb7503d)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1f8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff900);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
               in_stack_fffffffffffff940,in_stack_fffffffffffff938,in_stack_fffffffffffff930);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff900,(Type)(in_stack_fffffffffffff8f8 >> 0x20),
               (char *)in_stack_fffffffffffff8f0,(int)((ulong)in_stack_fffffffffffff8e8 >> 0x20),
               (char *)in_stack_fffffffffffff8e0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff950,
               (Message *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8d0);
    std::__cxx11::string::~string(local_230);
    testing::Message::~Message((Message *)0xb75181);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb75218);
  google::
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::operator=((HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               *)in_stack_fffffffffffff8d0,
              (HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
  local_241 = google::
              BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::operator==((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                            *)in_stack_fffffffffffff8d0,
                           (BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff8d0,
             (bool *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8),(type *)0xb75276)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_240);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff900);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
               in_stack_fffffffffffff940,in_stack_fffffffffffff938,in_stack_fffffffffffff930);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff900,(Type)(in_stack_fffffffffffff8f8 >> 0x20),
               (char *)in_stack_fffffffffffff8f0,(int)((ulong)in_stack_fffffffffffff8e8 >> 0x20),
               (char *)in_stack_fffffffffffff8e0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff950,
               (Message *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8d0);
    std::__cxx11::string::~string(local_278);
    testing::Message::~Message((Message *)0xb7534b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb753e2);
  google::
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)0xb753ef);
  google::
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)0xb753fc);
  i = 0;
  Hasher::Hasher(local_30c,0);
  Hasher::Hasher(&local_318,i);
  this_02 = (BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             *)(ulong)i;
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::Alloc(&local_328,i,(int *)this_02);
  google::
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            (in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0,
             in_stack_fffffffffffff8e8,(allocator_type *)in_stack_fffffffffffff8e0);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_328);
  Hasher::Hasher(local_3bc,0);
  Hasher::Hasher(&local_3c8,0);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::Alloc(&local_3d8,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            (in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0,
             in_stack_fffffffffffff8e8,(allocator_type *)in_stack_fffffffffffff8e0);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_3d8);
  local_3e0 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff8d0,in_stack_fffffffffffff8cc);
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(this_02,(value_type *)CONCAT44(i,in_stack_fffffffffffff948));
  google::
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::operator=((HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               *)in_stack_fffffffffffff8d0,
              (HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
  local_41c = 0;
  local_428 = google::
              BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xb75579);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff8e8,(char *)in_stack_fffffffffffff8e0,
             in_stack_fffffffffffff8d8,(unsigned_long *)in_stack_fffffffffffff8d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_418);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff900);
    testing::AssertionResult::failure_message((AssertionResult *)0xb7569b);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff900,(Type)(in_stack_fffffffffffff8f8 >> 0x20),
               (char *)in_stack_fffffffffffff8f0,(int)((ulong)in_stack_fffffffffffff8e8 >> 0x20),
               (char *)in_stack_fffffffffffff8e0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)this_02,(Message *)CONCAT44(i,in_stack_fffffffffffff948));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8d0);
    testing::Message::~Message((Message *)0xb756f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb75769);
  google::
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)0xb75776);
  google::
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)0xb75783);
  Hasher::Hasher(local_4cc,0);
  Hasher::Hasher(&local_4d8,0);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::Alloc(&local_4e8,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            (in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0,
             in_stack_fffffffffffff8e8,(allocator_type *)in_stack_fffffffffffff8e0);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_4e8);
  Hasher::Hasher(local_57c,0);
  Hasher::Hasher(&local_588,0);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::Alloc(&local_598,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            (in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0,
             in_stack_fffffffffffff8e8,(allocator_type *)in_stack_fffffffffffff8e0);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_598);
  this_00 = (AssertHelper *)
            HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffff8e0,(int)((ulong)in_stack_fffffffffffff8d8 >> 0x20));
  local_5a0 = this_00;
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                     *)in_stack_fffffffffffff8d0,
                    (key_type *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
  pcVar2 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueObject(in_stack_fffffffffffff8d0,in_stack_fffffffffffff8cc);
  local_5a8 = pcVar2;
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(this_02,(value_type *)CONCAT44(i,in_stack_fffffffffffff948));
  type = (Type)((ulong)pcVar2 >> 0x20);
  google::
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::operator=((HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               *)in_stack_fffffffffffff8d0,
              (HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
  local_5e4 = 1;
  file = (char *)google::
                 BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                 ::size((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                         *)0xb7591c);
  local_5f0 = file;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff8e8,(char *)in_stack_fffffffffffff8e0,
             in_stack_fffffffffffff8d8,(unsigned_long *)in_stack_fffffffffffff8d0);
  iVar3 = (int)((ulong)in_stack_fffffffffffff8d8 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_5e0);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffff8e8 =
         (key_equal *)testing::AssertionResult::failure_message((AssertionResult *)0xb75a3e);
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,file,(int)((ulong)in_stack_fffffffffffff8e8 >> 0x20),
               (char *)in_stack_fffffffffffff8e0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)this_02,(Message *)CONCAT44(i,in_stack_fffffffffffff948));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8d0);
    testing::Message::~Message((Message *)0xb75a9b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb75b0c);
  rhs_expression =
       HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       ::UniqueKey(in_stack_fffffffffffff8e0,iVar3);
  lhs = (uint *)google::
                BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                ::count((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                         *)in_stack_fffffffffffff8d0,
                        (key_type *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff8e8,rhs_expression,lhs,
             (unsigned_long *)in_stack_fffffffffffff8d0);
  iVar3 = (int)((ulong)in_stack_fffffffffffff8e8 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_610);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    this_01 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xb75bd9)
    ;
    testing::internal::AssertHelper::AssertHelper(this_00,type,file,iVar3,rhs_expression);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)this_02,(Message *)CONCAT44(i,in_stack_fffffffffffff948));
    testing::internal::AssertHelper::~AssertHelper(this_01);
    testing::Message::~Message((Message *)0xb75c36);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb75ca1);
  google::
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)0xb75cae);
  google::
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)0xb75cbb);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, OperatorEquals) {
  {
    TypeParam ht1, ht2;
    ht1.set_deleted_key(this->UniqueKey(1));
    ht2.set_deleted_key(this->UniqueKey(2));

    ht1.insert(this->UniqueObject(10));
    ht2.insert(this->UniqueObject(20));
    EXPECT_FALSE(ht1 == ht2);
    ht1 = ht2;
    EXPECT_TRUE(ht1 == ht2);
  }
  {
    TypeParam ht1, ht2;
    ht1.insert(this->UniqueObject(30));
    ht1 = ht2;
    EXPECT_EQ(0u, ht1.size());
  }
  {
    TypeParam ht1, ht2;
    ht1.set_deleted_key(this->UniqueKey(1));
    ht2.insert(this->UniqueObject(1));  // has same key as ht1.delkey
    ht1 = ht2;                          // should reset deleted-key to 'unset'
    EXPECT_EQ(1u, ht1.size());
    EXPECT_EQ(1u, ht1.count(this->UniqueKey(1)));
  }
}